

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int i;
  int i_00;
  int iVar2;
  pointer pMVar3;
  pointer pMVar4;
  Layer *pLVar5;
  long lVar6;
  int iVar7;
  ParamDict pd;
  Mat bias_data_flattened;
  ModelBinFromMatArray local_128;
  Mat weight_data_flattened;
  Mat weights [2];
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = pMVar3[1].elempack;
  i = pMVar3[1].w;
  i_00 = pMVar3[1].h;
  iVar2 = pMVar3[1].c;
  weight_data_flattened.cstep = 0;
  weight_data_flattened.data = (void *)0x0;
  weight_data_flattened.refcount._0_4_ = 0;
  weight_data_flattened.refcount._4_4_ = 0;
  weight_data_flattened.elemsize._0_4_ = 0;
  weight_data_flattened.elemsize._4_4_ = 0;
  weight_data_flattened.elempack = 0;
  weight_data_flattened.allocator = (Allocator *)0x0;
  weight_data_flattened.dims = 0;
  weight_data_flattened.w = 0;
  weight_data_flattened.h = 0;
  weight_data_flattened.d = 0;
  weight_data_flattened.c = 0;
  flatten(pMVar3 + 1,&weight_data_flattened,opt);
  iVar7 = -100;
  bias_data_flattened.elemsize =
       CONCAT44(bias_data_flattened.elemsize._4_4_,(undefined4)bias_data_flattened.elemsize);
  weight_data_flattened.elemsize =
       CONCAT44(weight_data_flattened.elemsize._4_4_,(undefined4)weight_data_flattened.elemsize);
  if ((weight_data_flattened.data == (void *)0x0) ||
     (bias_data_flattened.elemsize =
           CONCAT44(bias_data_flattened.elemsize._4_4_,(undefined4)bias_data_flattened.elemsize),
     weight_data_flattened.elemsize =
          CONCAT44(weight_data_flattened.elemsize._4_4_,(undefined4)weight_data_flattened.elemsize),
     (long)weight_data_flattened.c * weight_data_flattened.cstep == 0)) goto LAB_00253cd4;
  weight_data_flattened.w = weight_data_flattened.w * weight_data_flattened.elempack;
  weight_data_flattened.elemsize =
       CONCAT44(weight_data_flattened.elemsize._4_4_,(undefined4)weight_data_flattened.elemsize) /
       (ulong)(long)weight_data_flattened.elempack;
  weight_data_flattened.elempack = 1;
  bias_data_flattened.cstep = 0;
  bias_data_flattened.data = (void *)0x0;
  bias_data_flattened.refcount._0_4_ = 0;
  bias_data_flattened.refcount._4_4_ = 0;
  bias_data_flattened.elemsize._0_4_ = 0;
  bias_data_flattened.elemsize._4_4_ = 0;
  bias_data_flattened.elemsize = 0;
  bias_data_flattened.elempack = 0;
  bias_data_flattened.allocator = (Allocator *)0x0;
  bias_data_flattened.dims = 0;
  bias_data_flattened.w = 0;
  bias_data_flattened.h = 0;
  bias_data_flattened.d = 0;
  bias_data_flattened.c = 0;
  if (*(int *)(&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) == 0) {
LAB_002539e5:
    pLVar5 = create_layer(0x2a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,iVar1 * iVar2);
    ParamDict::set(&pd,1,i);
    ParamDict::set(&pd,0xb,i_00);
    ParamDict::set(&pd,2,*(int *)(&this->field_0xdc + (long)this->_vptr_ConvolutionDepthWise_x86[-3]
                                 ));
    ParamDict::set(&pd,0xc,*(int *)(&this->field_0xe0 +
                                   (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,3,*(int *)(&this->field_0xe4 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]
                                 ));
    ParamDict::set(&pd,0xd,*(int *)(&this->field_0xe8 +
                                   (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,4,*(int *)(&this->field_0xec + (long)this->_vptr_ConvolutionDepthWise_x86[-3]
                                 ));
    ParamDict::set(&pd,0xf,*(int *)(&this->field_0xf0 +
                                   (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,0xe,*(int *)(&this->field_0xf4 +
                                   (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,0x10,*(int *)(&this->field_0xf8 +
                                    (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,0x12,*(float *)(&this->field_0xfc +
                                      (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,5,*(int *)(&this->field_0x100 +
                                 (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,6,weight_data_flattened.w);
    ParamDict::set(&pd,7,*(int *)(&this->field_0x108 +
                                 (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,8,*(int *)(&this->field_0x10c +
                                 (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,9,*(int *)(&this->field_0x110 +
                                 (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    ParamDict::set(&pd,10,(Mat *)(&this->field_0x118 +
                                 (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&pd);
    weights[0].elemsize._0_4_ = 0;
    weights[0]._20_8_ = 0;
    weights[0].data = (void *)0x0;
    weights[0].refcount._0_4_ = 0;
    weights[0].refcount._4_4_ = 0;
    weights[0].allocator = (Allocator *)0x0;
    weights[0].dims = 0;
    weights[0].w = 0;
    weights[0].h = 0;
    weights[0].d = 0;
    weights[0].c = 0;
    weights[1].cstep = 0;
    weights[1].allocator = (Allocator *)0x0;
    weights[1].dims = 0;
    weights[1].w = 0;
    weights[1].h = 0;
    weights[1].d = 0;
    weights[1].c = 0;
    weights[0].cstep = 0;
    weights[1].data = (void *)0x0;
    weights[1].refcount = (int *)0x0;
    weights[1].elemsize = 0;
    weights[1].elempack = 0;
    Mat::operator=(weights,&weight_data_flattened);
    Mat::operator=(weights + 1,&bias_data_flattened);
    ModelBinFromMatArray::ModelBinFromMatArray(&local_128,weights);
    (*pLVar5->_vptr_Layer[3])(pLVar5,&local_128);
    ModelBinFromMatArray::~ModelBinFromMatArray(&local_128);
    (*pLVar5->_vptr_Layer[4])(pLVar5,opt);
    (*pLVar5->_vptr_Layer[7])(pLVar5,pMVar3,pMVar4,opt);
    (*pLVar5->_vptr_Layer[5])(pLVar5,opt);
    (*pLVar5->_vptr_Layer[1])(pLVar5);
    lVar6 = 0x48;
    do {
      Mat::~Mat((Mat *)((long)&weights[0].data + lVar6));
      lVar6 = lVar6 + -0x48;
    } while (lVar6 != -0x48);
    ParamDict::~ParamDict(&pd);
    iVar7 = 0;
  }
  else {
    flatten((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start + 2,&bias_data_flattened,opt);
    iVar7 = -100;
    bias_data_flattened.elemsize =
         CONCAT44(bias_data_flattened.elemsize._4_4_,(undefined4)bias_data_flattened.elemsize);
    if ((bias_data_flattened.data != (void *)0x0) &&
       (bias_data_flattened.elemsize =
             CONCAT44(bias_data_flattened.elemsize._4_4_,(undefined4)bias_data_flattened.elemsize),
       (long)bias_data_flattened.c * bias_data_flattened.cstep != 0)) {
      bias_data_flattened.w = bias_data_flattened.w * bias_data_flattened.elempack;
      bias_data_flattened.elemsize =
           CONCAT44(bias_data_flattened.elemsize._4_4_,(undefined4)bias_data_flattened.elemsize) /
           (ulong)(long)bias_data_flattened.elempack;
      bias_data_flattened.elempack = 1;
      goto LAB_002539e5;
    }
  }
  Mat::~Mat(&bias_data_flattened);
LAB_00253cd4:
  Mat::~Mat(&weight_data_flattened);
  return iVar7;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.c * _weight_data.elempack;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // weight_data_flattened as pack1
    weight_data_flattened.w *= weight_data_flattened.elempack;
    weight_data_flattened.elemsize /= weight_data_flattened.elempack;
    weight_data_flattened.elempack = 1;

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;

        // bias_data_flattened as pack1
        bias_data_flattened.w *= bias_data_flattened.elempack;
        bias_data_flattened.elemsize /= bias_data_flattened.elempack;
        bias_data_flattened.elempack = 1;
    }

    ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::ConvolutionDepthWise);

    ncnn::ParamDict pd;
    pd.set(0, _num_output);
    pd.set(1, _kernel_w);
    pd.set(11, _kernel_h);
    pd.set(2, dilation_w);
    pd.set(12, dilation_h);
    pd.set(3, stride_w);
    pd.set(13, stride_h);
    pd.set(4, pad_left);
    pd.set(15, pad_right);
    pd.set(14, pad_top);
    pd.set(16, pad_bottom);
    pd.set(18, pad_value);
    pd.set(5, bias_term);
    pd.set(6, weight_data_flattened.w);
    pd.set(7, group);
    pd.set(8, int8_scale_term);
    pd.set(9, activation_type);
    pd.set(10, activation_params);

    op->load_param(pd);

    ncnn::Mat weights[2];
    weights[0] = weight_data_flattened;
    weights[1] = bias_data_flattened;

    op->load_model(ncnn::ModelBinFromMatArray(weights));

    op->create_pipeline(opt);

    op->forward(bottom_blob, top_blob, opt);

    op->destroy_pipeline(opt);

    delete op;

    return 0;
}